

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

int htmlSetMetaEncoding(htmlDocPtr doc,xmlChar *encoding)

{
  _xmlNode *p_Var1;
  xmlChar *str1;
  bool bVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlNodePtr cur;
  _xmlAttr *p_Var5;
  _xmlNode *cur_00;
  char newcontent [100];
  _xmlNode *local_a8;
  xmlChar local_98 [99];
  undefined1 local_35;
  
  local_98[0] = '\0';
  if (doc == (htmlDocPtr)0x0) {
    return -1;
  }
  iVar3 = xmlStrcasecmp(encoding,"html");
  if (iVar3 == 0) {
    return -1;
  }
  if (encoding != (xmlChar *)0x0) {
    snprintf((char *)local_98,100,"text/html; charset=%s");
    local_35 = 0;
  }
  cur_00 = doc->children;
  if (cur_00 == (_xmlNode *)0x0) {
    return -1;
  }
  local_a8 = (_xmlNode *)0x0;
  do {
    if ((cur_00->type == XML_ELEMENT_NODE) && (cur_00->name != (xmlChar *)0x0)) {
      iVar3 = xmlStrcasecmp(cur_00->name,"html");
      if (iVar3 == 0) {
        cur_00 = cur_00->children;
        break;
      }
      iVar3 = xmlStrcasecmp(cur_00->name,"head");
      if (iVar3 == 0) goto LAB_0016c39d;
      iVar3 = xmlStrcasecmp(cur_00->name,(xmlChar *)"meta");
      if (iVar3 == 0) goto LAB_0016c3b5;
    }
    cur_00 = cur_00->next;
    if (cur_00 == (_xmlNode *)0x0) {
      return -1;
    }
  } while( true );
joined_r0x0016c34b:
  if (cur_00 == (_xmlNode *)0x0) {
    return -1;
  }
  if ((cur_00->type == XML_ELEMENT_NODE) && (cur_00->name != (xmlChar *)0x0)) {
    iVar3 = xmlStrcasecmp(cur_00->name,"head");
    if (iVar3 == 0) {
LAB_0016c39d:
      p_Var1 = cur_00->children;
      local_a8 = cur_00;
      goto joined_r0x0016c3a8;
    }
    iVar3 = xmlStrcasecmp(cur_00->name,(xmlChar *)"meta");
    if (iVar3 == 0) {
      local_a8 = cur_00->parent;
      goto LAB_0016c3b5;
    }
  }
  cur_00 = cur_00->next;
  goto joined_r0x0016c34b;
LAB_0016c3b5:
  if ((((cur_00->type == XML_ELEMENT_NODE) && (cur_00->name != (xmlChar *)0x0)) &&
      (iVar3 = xmlStrcasecmp(cur_00->name,(xmlChar *)"meta"), iVar3 == 0)) &&
     (p_Var5 = cur_00->properties, p_Var5 != (_xmlAttr *)0x0)) {
    bVar2 = false;
    pxVar4 = (xmlChar *)0x0;
    do {
      p_Var1 = p_Var5->children;
      if (((p_Var1 != (_xmlNode *)0x0) && (p_Var1->type == XML_TEXT_NODE)) &&
         (p_Var1->next == (_xmlNode *)0x0)) {
        str1 = p_Var1->content;
        iVar3 = xmlStrcasecmp(p_Var5->name,(xmlChar *)"http-equiv");
        if ((iVar3 == 0) && (iVar3 = xmlStrcasecmp(str1,(xmlChar *)"Content-Type"), iVar3 == 0)) {
          bVar2 = true;
        }
        else if ((str1 != (xmlChar *)0x0) &&
                (iVar3 = xmlStrcasecmp(p_Var5->name,"content"), iVar3 == 0)) {
          pxVar4 = str1;
        }
        if ((bVar2) && (pxVar4 != (xmlChar *)0x0)) {
          bVar2 = true;
          break;
        }
      }
      p_Var5 = p_Var5->next;
    } while (p_Var5 != (_xmlAttr *)0x0);
    if ((bVar2) && (pxVar4 != (xmlChar *)0x0)) {
      if (cur_00 != (xmlNodePtr)0x0) {
        if (encoding == (xmlChar *)0x0) {
          xmlUnlinkNode(cur_00);
          xmlFreeNode(cur_00);
          return 0;
        }
        pxVar4 = xmlStrcasestr(pxVar4,encoding);
        if (pxVar4 != (xmlChar *)0x0) {
          return 0;
        }
        xmlSetProp(cur_00,"content",local_98);
        return 0;
      }
      goto LAB_0016c4bf;
    }
  }
  p_Var1 = cur_00->next;
joined_r0x0016c3a8:
  cur_00 = p_Var1;
  if (cur_00 == (_xmlNode *)0x0) {
LAB_0016c4bf:
    if ((encoding != (xmlChar *)0x0) && (local_a8 != (xmlNodePtr)0x0)) {
      cur = xmlNewDocNode(doc,(xmlNsPtr)0x0,(xmlChar *)"meta",(xmlChar *)0x0);
      if (local_a8->children == (xmlNodePtr)0x0) {
        xmlAddChild(local_a8,cur);
      }
      else {
        xmlAddPrevSibling(local_a8->children,cur);
      }
      xmlNewProp(cur,(xmlChar *)"http-equiv",(xmlChar *)"Content-Type");
      xmlNewProp(cur,"content",local_98);
    }
    return 0;
  }
  goto LAB_0016c3b5;
}

Assistant:

int
htmlSetMetaEncoding(htmlDocPtr doc, const xmlChar *encoding) {
    htmlNodePtr cur, meta = NULL, head = NULL;
    const xmlChar *content = NULL;
    char newcontent[100];

    newcontent[0] = 0;

    if (doc == NULL)
	return(-1);

    /* html isn't a real encoding it's just libxml2 way to get entities */
    if (!xmlStrcasecmp(encoding, BAD_CAST "html"))
        return(-1);

    if (encoding != NULL) {
	snprintf(newcontent, sizeof(newcontent), "text/html; charset=%s",
                (char *)encoding);
	newcontent[sizeof(newcontent) - 1] = 0;
    }

    cur = doc->children;

    /*
     * Search the html
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrcasecmp(cur->name, BAD_CAST"html") == 0)
		break;
	    if (xmlStrcasecmp(cur->name, BAD_CAST"head") == 0)
		goto found_head;
	    if (xmlStrcasecmp(cur->name, BAD_CAST"meta") == 0)
		goto found_meta;
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(-1);
    cur = cur->children;

    /*
     * Search the head
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrcasecmp(cur->name, BAD_CAST"head") == 0)
		break;
	    if (xmlStrcasecmp(cur->name, BAD_CAST"meta") == 0) {
                head = cur->parent;
		goto found_meta;
            }
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(-1);
found_head:
    head = cur;
    if (cur->children == NULL)
        goto create;
    cur = cur->children;

found_meta:
    /*
     * Search and update all the remaining the meta elements carrying
     * encoding information
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrcasecmp(cur->name, BAD_CAST"meta") == 0) {
		xmlAttrPtr attr = cur->properties;
		int http;
		const xmlChar *value;

		content = NULL;
		http = 0;
		while (attr != NULL) {
		    if ((attr->children != NULL) &&
		        (attr->children->type == XML_TEXT_NODE) &&
		        (attr->children->next == NULL)) {
			value = attr->children->content;
			if ((!xmlStrcasecmp(attr->name, BAD_CAST"http-equiv"))
			 && (!xmlStrcasecmp(value, BAD_CAST"Content-Type")))
			    http = 1;
			else
                        {
                           if ((value != NULL) &&
                               (!xmlStrcasecmp(attr->name, BAD_CAST"content")))
			       content = value;
                        }
		        if ((http != 0) && (content != NULL))
			    break;
		    }
		    attr = attr->next;
		}
		if ((http != 0) && (content != NULL)) {
		    meta = cur;
		    break;
		}

	    }
	}
	cur = cur->next;
    }
create:
    if (meta == NULL) {
        if ((encoding != NULL) && (head != NULL)) {
            /*
             * Create a new Meta element with the right attributes
             */

            meta = xmlNewDocNode(doc, NULL, BAD_CAST"meta", NULL);
            if (head->children == NULL)
                xmlAddChild(head, meta);
            else
                xmlAddPrevSibling(head->children, meta);
            xmlNewProp(meta, BAD_CAST"http-equiv", BAD_CAST"Content-Type");
            xmlNewProp(meta, BAD_CAST"content", BAD_CAST newcontent);
        }
    } else {
        /* remove the meta tag if NULL is passed */
        if (encoding == NULL) {
            xmlUnlinkNode(meta);
            xmlFreeNode(meta);
        }
        /* change the document only if there is a real encoding change */
        else if (xmlStrcasestr(content, encoding) == NULL) {
            xmlSetProp(meta, BAD_CAST"content", BAD_CAST newcontent);
        }
    }


    return(0);
}